

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

SQObject __thiscall SQFuncState::CreateTable(SQFuncState *this)

{
  SQTable *x;
  SQSharedState *in_RDI;
  SQObject SVar1;
  SQObjectPtr nt;
  SQInteger in_stack_ffffffffffffff98;
  SQObjectValue in_stack_ffffffffffffffc8;
  SQObjectPtr *in_stack_ffffffffffffffd0;
  SQObjectValue in_stack_ffffffffffffffd8;
  
  x = SQTable::Create(in_RDI,in_stack_ffffffffffffff98);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffd0,x);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffc0,1);
  SQTable::NewSlot(in_stack_ffffffffffffffd8.pTable,in_stack_ffffffffffffffd0,
                   (SQObjectPtr *)in_stack_ffffffffffffffc8.pTable);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RDI);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RDI);
  SVar1._0_8_ = (ulong)in_stack_ffffffffffffffd0 & 0xffffffff;
  SVar1._unVal.pTable = in_stack_ffffffffffffffd8.pTable;
  return SVar1;
}

Assistant:

SQObject SQFuncState::CreateTable()
{
    SQObjectPtr nt(SQTable::Create(_sharedstate,0));
    _table(_strings)->NewSlot(nt,(SQInteger)1);
    return nt;
}